

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreePrevious(BtCursor *pCur)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  MemPage *pMVar8;
  undefined8 in_RSI;
  
  bVar4 = pCur->eState;
  if (bVar4 != 1) {
    if (2 < bVar4) {
      iVar6 = btreeRestoreCursorPosition(pCur);
      if (iVar6 != 0) {
        return iVar6;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 0) {
      return 0x65;
    }
    iVar6 = pCur->skipNext;
    if (iVar6 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar6 < 0) {
        return 0;
      }
    }
  }
  iVar6 = (int)in_RSI;
  pMVar8 = pCur->apPage[pCur->iPage];
  uVar2 = pCur->ix;
  if (pMVar8->leaf == '\0') {
    uVar3 = *(uint *)(pMVar8->aData +
                     (CONCAT11(pMVar8->aCellIdx[(ulong)uVar2 * 2],
                               pMVar8->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar8->maskPage));
    iVar5 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                             uVar3 << 0x18);
    if (iVar5 == 0) {
      iVar6 = moveToRightmost(pCur);
      return iVar6;
    }
  }
  else {
    if (uVar2 == 0) {
      do {
        cVar1 = pCur->iPage;
        lVar7 = (long)cVar1;
        if (lVar7 == 0) {
          pCur->eState = '\0';
          return 0x65;
        }
        (pCur->info).nSize = 0;
        pCur->curFlags = pCur->curFlags & 0xf9;
        pCur->ix = pCur->aiIdx[lVar7 + -1];
        pCur->iPage = cVar1 + -1;
        sqlite3PagerUnrefNotNull(pCur->apPage[lVar7]->pDbPage);
        iVar6 = (int)in_RSI;
        uVar2 = pCur->ix;
      } while (uVar2 == 0);
      pMVar8 = pCur->apPage[pCur->iPage];
    }
    pCur->ix = uVar2 - 1;
    iVar5 = 0;
    if ((pMVar8->intKey != '\0') && (pMVar8->leaf == '\0')) {
      iVar6 = sqlite3BtreePrevious(pCur,iVar6);
      return iVar6;
    }
  }
  return iVar5;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->skipNext ){
      assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_SKIPNEXT );
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ){
        pCur->skipNext = 0;
        return SQLITE_OK;
      }
      pCur->skipNext = 0;
    }
  }

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}